

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTOpenGlider.cpp
# Opt level: O1

void __thiscall OpenGliderConnection::Stop(OpenGliderConnection *this,bool bWaitJoin)

{
  char cVar1;
  ssize_t sVar2;
  
  if ((this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.thr._M_id._M_thread !=
      0) {
    if ((int)(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.eThrStatus < 3)
    {
      (this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.eThrStatus = THR_STOP;
    }
    if (this->aprsPipe[1] != -1) {
      sVar2 = write(this->aprsPipe[1],"STOP",4);
      if (-1 < sVar2) goto LAB_0018a281;
    }
    XPMP2::TCPConnection::Close(&this->tcpAprs);
  }
LAB_0018a281:
  LTChannel::Stop((LTChannel *)this,bWaitJoin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ifstream::close();
  }
  this->bFailoverToHttp = false;
  return;
}

Assistant:

void OpenGliderConnection::Stop (bool bWaitJoin)
{
    if (isRunning()) {
        if (eThrStatus < THR_STOP)
            eThrStatus = THR_STOP;          // indicate to the thread that it has to end itself
        
#if APL == 1 || LIN == 1
        // Mac/Lin: Try writing something to the self-pipe to stop gracefully
        if (aprsPipe[1] == INVALID_SOCKET ||
            write(aprsPipe[1], "STOP", 4) < 0)
        {
            // if the self-pipe didn't work:
#endif
            // close all connections, this will also break out of all
            // blocking calls for receiving message and hence terminate the threads
            tcpAprs.Close();
#if APL == 1 || LIN == 1
        }
#endif
    }
    
    // standard Closing
    LTFlightDataChannel::Stop(bWaitJoin);
    
    // Close a/c list
    if (ifAcList.is_open())
        ifAcList.close();
    bFailoverToHttp = false;
}